

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histogram_test.cc
# Opt level: O0

void __thiscall
prometheus::anon_unknown_0::HistogramTest_sample_sum_Test::TestBody
          (HistogramTest_sample_sum_Test *this)

{
  initializer_list<double> __l;
  bool bVar1;
  char *message;
  AssertHelper local_198;
  Message local_190;
  int local_184;
  undefined1 local_180 [8];
  AssertionResult gtest_ar;
  Histogram h;
  ClientMetric metric;
  allocator<double> local_a1;
  double local_a0;
  iterator local_98;
  size_type local_90;
  vector<double,_std::allocator<double>_> local_88;
  undefined1 local_70 [8];
  Histogram histogram;
  HistogramTest_sample_sum_Test *this_local;
  
  local_a0 = 1.0;
  local_98 = &local_a0;
  local_90 = 1;
  histogram.sum_.value_._M_i = (atomic<double>)(atomic<double>)this;
  std::allocator<double>::allocator(&local_a1);
  __l._M_len = local_90;
  __l._M_array = local_98;
  std::vector<double,_std::allocator<double>_>::vector(&local_88,__l,&local_a1);
  Histogram::Histogram((Histogram *)local_70,&local_88);
  std::vector<double,_std::allocator<double>_>::~vector(&local_88);
  std::allocator<double>::~allocator(&local_a1);
  Histogram::Observe((Histogram *)local_70,0.0);
  Histogram::Observe((Histogram *)local_70,1.0);
  Histogram::Observe((Histogram *)local_70,101.0);
  Histogram::Collect((ClientMetric *)
                     &h.bucket.
                      super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage,(Histogram *)local_70);
  ClientMetric::Histogram::Histogram
            ((Histogram *)&gtest_ar.message_,
             (Histogram *)
             &metric.summary.quantile.
              super__Vector_base<prometheus::ClientMetric::Quantile,_std::allocator<prometheus::ClientMetric::Quantile>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  local_184 = 0x66;
  testing::internal::EqHelper::Compare<double,_int,_nullptr>
            ((EqHelper *)local_180,"h.sample_sum","102",(double *)&h,&local_184);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_180);
  if (!bVar1) {
    testing::Message::Message(&local_190);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_180);
    testing::internal::AssertHelper::AssertHelper
              (&local_198,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/jupp0r[P]prometheus-cpp/core/tests/histogram_test.cc"
               ,0x24,message);
    testing::internal::AssertHelper::operator=(&local_198,&local_190);
    testing::internal::AssertHelper::~AssertHelper(&local_198);
    testing::Message::~Message(&local_190);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_180);
  ClientMetric::Histogram::~Histogram((Histogram *)&gtest_ar.message_);
  ClientMetric::~ClientMetric
            ((ClientMetric *)
             &h.bucket.
              super__Vector_base<prometheus::ClientMetric::Bucket,_std::allocator<prometheus::ClientMetric::Bucket>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  Histogram::~Histogram((Histogram *)local_70);
  return;
}

Assistant:

TEST(HistogramTest, sample_sum) {
  Histogram histogram{{1}};
  histogram.Observe(0);
  histogram.Observe(1);
  histogram.Observe(101);
  auto metric = histogram.Collect();
  auto h = metric.histogram;
  EXPECT_EQ(h.sample_sum, 102);
}